

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  ImVec2 *pIVar1;
  ImDrawListSplitter *pIVar2;
  undefined4 uVar3;
  double dVar4;
  uint uVar5;
  int iVar6;
  ImGuiWindow *outer_window;
  ImGuiTable *pIVar7;
  ImGuiTableTempData *pIVar8;
  ImGuiWindow *pIVar9;
  void *pvVar10;
  ImGuiTableColumn *pIVar11;
  ImVec2 IVar12;
  ImGuiContext *pIVar13;
  void *pvVar14;
  bool bVar15;
  uint uVar16;
  ImU32 IVar17;
  ImGuiTable *table;
  ImRect *pIVar18;
  void *ptr;
  long lVar19;
  long lVar20;
  ImGuiContext *g;
  undefined1 *puVar21;
  int iVar22;
  undefined8 *puVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  ImGuiTableColumn *pIVar27;
  byte bVar28;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  ImRect IVar33;
  ImRect outer_rect;
  ImGuiTableTempData local_a8;
  
  pIVar13 = GImGui;
  bVar28 = 0;
  outer_window = GImGui->CurrentWindow;
  outer_window->WriteAccessed = true;
  if (outer_window->SkipItems != false) {
    return false;
  }
  IVar12 = GetContentRegionAvail();
  fVar30 = IVar12.y;
  auVar29._8_4_ = extraout_XMM0_Dc;
  auVar29._0_4_ = IVar12.x;
  auVar29._4_4_ = IVar12.y;
  auVar29._12_4_ = extraout_XMM0_Dd;
  if (IVar12.x <= 1.0) {
    auVar29._0_4_ = 0x3f800000;
  }
  if ((flags & 0x3000000U) == 0) {
    IVar12 = CalcItemSize(*outer_size,auVar29._0_4_,0.0);
    outer_rect.Min = (outer_window->DC).CursorPos;
    outer_rect.Max.y = IVar12.y + outer_rect.Min.y;
    outer_rect.Max.x = IVar12.x + outer_rect.Min.x;
  }
  else {
    if (fVar30 <= 1.0) {
      fVar30 = 1.0;
    }
    IVar12 = CalcItemSize(*outer_size,auVar29._0_4_,fVar30);
    outer_rect.Min = (outer_window->DC).CursorPos;
    outer_rect.Max.y = IVar12.y + outer_rect.Min.y;
    outer_rect.Max.x = IVar12.x + outer_rect.Min.x;
    bVar15 = IsClippedEx(&outer_rect,0);
    if (bVar15) {
      ItemSize(&outer_rect,-1.0);
      return false;
    }
  }
  table = ImPool<ImGuiTable>::GetOrAddByKey(&pIVar13->Tables,id);
  iVar22 = 0;
  if (table->LastFrameActive == pIVar13->FrameCount) {
    iVar22 = table->InstanceCurrent + 1;
  }
  uVar5 = table->Flags;
  pIVar7 = (pIVar13->Tables).Buf.Data;
  iVar6 = pIVar13->TablesTempDataStacked;
  iVar25 = iVar6 + 1;
  pIVar13->TablesTempDataStacked = iVar25;
  if ((pIVar13->TablesTempData).Size <= iVar6) {
    local_a8.UserOuterSize.x = 0.0;
    local_a8.UserOuterSize.y = 0.0;
    local_a8.HostBackupColumnsOffset.x = 0.0;
    local_a8.HostBackupItemWidth = 0.0;
    local_a8.HostBackupItemWidthStackSize = 0;
    local_a8._108_4_ = 0;
    local_a8.HostBackupCurrLineSize.x = 0.0;
    local_a8.HostBackupCurrLineSize.y = 0.0;
    local_a8.HostBackupCursorMaxPos.x = 0.0;
    local_a8.HostBackupCursorMaxPos.y = 0.0;
    local_a8.HostBackupParentWorkRect.Max.x = 0.0;
    local_a8.HostBackupParentWorkRect.Max.y = 0.0;
    local_a8.HostBackupPrevLineSize.x = 0.0;
    local_a8.HostBackupPrevLineSize.y = 0.0;
    local_a8.HostBackupWorkRect.Max.x = 0.0;
    local_a8.HostBackupWorkRect.Max.y = 0.0;
    local_a8.HostBackupParentWorkRect.Min.x._0_3_ = 0;
    local_a8.HostBackupParentWorkRect.Min._3_5_ = 0;
    local_a8.DrawSplitter._Channels.Data = (ImDrawChannel *)0x0;
    local_a8.HostBackupWorkRect.Min.x._0_3_ = 0;
    local_a8.HostBackupWorkRect.Min._3_5_ = 0;
    local_a8.DrawSplitter._Current = 0;
    local_a8.DrawSplitter._Count = 0;
    local_a8.DrawSplitter._Channels.Size = 0;
    local_a8.DrawSplitter._Channels.Capacity = 0;
    local_a8.TableIndex = 0;
    local_a8.LastTimeActive = -1.0;
    ImVector<ImGuiTableTempData>::resize(&pIVar13->TablesTempData,iVar25,&local_a8);
    ImDrawListSplitter::~ImDrawListSplitter(&local_a8.DrawSplitter);
    iVar25 = pIVar13->TablesTempDataStacked;
  }
  pIVar8 = (pIVar13->TablesTempData).Data;
  lVar19 = (long)iVar25;
  table->TempData = pIVar8 + lVar19 + -1;
  iVar25 = (int)(((long)table - (long)pIVar7) / 0x208);
  pIVar8[lVar19 + -1].TableIndex = iVar25;
  pIVar2 = &pIVar8[lVar19 + -1].DrawSplitter;
  table->DrawSplitter = pIVar2;
  pIVar2->_Current = 0;
  pIVar2->_Count = 1;
  table->IsDefaultSizingPolicy = (flags & 0xe000U) == 0;
  uVar16 = TableFixFlags(flags,outer_window);
  table->ID = id;
  table->Flags = uVar16;
  table->InstanceCurrent = (ImS16)iVar22;
  table->LastFrameActive = pIVar13->FrameCount;
  table->InnerWindow = outer_window;
  table->OuterWindow = outer_window;
  table->ColumnsCount = columns_count;
  table->IsLayoutLocked = false;
  table->InnerWidth = inner_width;
  *(ImVec2 *)((long)(pIVar2 + -1) + 0x10) = *outer_size;
  if ((flags & 0x3000000U) == 0) {
    pIVar18 = &outer_rect;
    (table->InnerRect).Min = outer_rect.Min;
    (table->InnerRect).Max = outer_rect.Max;
    (table->OuterRect).Min = outer_rect.Min;
    (table->OuterRect).Max = outer_rect.Max;
    lVar20 = 0x114;
  }
  else {
    fVar30 = inner_width;
    if ((uVar16 & 0x1000000) == 0) {
      fVar30 = 3.4028235e+38;
    }
    local_a8.LastTimeActive = 0.0;
    fVar30 = (float)(~-(uint)(0.0 < inner_width) & 0x7f7fffff |
                    (uint)fVar30 & -(uint)(0.0 < inner_width));
    if ((((uVar16 & 0x3000000) == 0x1000000) || (fVar30 != 3.4028235e+38)) || (NAN(fVar30))) {
      if ((uVar16 & 0x3000000) == 0x1000000) {
        local_a8.LastTimeActive = 1.1754944e-38;
      }
      local_a8.TableIndex = -(uint)(fVar30 != 3.4028235e+38) & (uint)fVar30;
      SetNextWindowContentSize((ImVec2 *)&local_a8);
    }
    if ((uVar5 & 0x3000000) == 0) {
      local_a8.TableIndex = 0;
      local_a8.LastTimeActive = 0.0;
      SetNextWindowScroll((ImVec2 *)&local_a8);
    }
    local_a8.TableIndex = (int)(outer_rect.Max.x - outer_rect.Min.x);
    local_a8.LastTimeActive = outer_rect.Max.y - outer_rect.Min.y;
    BeginChildEx(name,iVar22 + id,(ImVec2 *)&local_a8,false,(uVar16 & 0x1000000) >> 0xd);
    pIVar9 = pIVar13->CurrentWindow;
    table->InnerWindow = pIVar9;
    IVar12 = (pIVar9->WorkRect).Max;
    (table->WorkRect).Min = (pIVar9->WorkRect).Min;
    (table->WorkRect).Max = IVar12;
    IVar33 = ImGuiWindow::Rect(pIVar9);
    table->OuterRect = IVar33;
    pIVar18 = &table->InnerWindow->InnerRect;
    lVar20 = 0x104;
  }
  IVar12 = pIVar18->Max;
  pIVar1 = (ImVec2 *)((long)&table->ID + lVar20);
  *pIVar1 = pIVar18->Min;
  pIVar1[1] = IVar12;
  PushOverrideID(iVar22 + id);
  pIVar9 = table->InnerWindow;
  table->HostIndentX = (pIVar9->DC).Indent.x;
  IVar12 = (pIVar9->ClipRect).Max;
  (table->HostClipRect).Min = (pIVar9->ClipRect).Min;
  (table->HostClipRect).Max = IVar12;
  table->HostSkipItems = pIVar9->SkipItems;
  IVar12 = (pIVar9->WorkRect).Max;
  pIVar8[lVar19 + -1].HostBackupWorkRect.Min = (pIVar9->WorkRect).Min;
  pIVar8[lVar19 + -1].HostBackupWorkRect.Max = IVar12;
  IVar12 = (pIVar9->ParentWorkRect).Max;
  pIVar8[lVar19 + -1].HostBackupParentWorkRect.Min = (pIVar9->ParentWorkRect).Min;
  pIVar8[lVar19 + -1].HostBackupParentWorkRect.Max = IVar12;
  pIVar8[lVar19 + -1].HostBackupColumnsOffset.x = (outer_window->DC).ColumnsOffset.x;
  pIVar8[lVar19 + -1].HostBackupPrevLineSize = (pIVar9->DC).PrevLineSize;
  pIVar8[lVar19 + -1].HostBackupCurrLineSize = (pIVar9->DC).CurrLineSize;
  pIVar8[lVar19 + -1].HostBackupCursorMaxPos = (pIVar9->DC).CursorMaxPos;
  pIVar8[lVar19 + -1].HostBackupItemWidth = (outer_window->DC).ItemWidth;
  pIVar8[lVar19 + -1].HostBackupItemWidthStackSize = (outer_window->DC).ItemWidthStack.Size;
  fVar30 = 0.0;
  fVar32 = 0.0;
  if ((uVar16 >> 9 & 1) != 0) {
    fVar32 = 1.0;
  }
  (pIVar9->DC).CurrLineSize.x = 0.0;
  (pIVar9->DC).CurrLineSize.y = 0.0;
  (pIVar9->DC).PrevLineSize.x = 0.0;
  (pIVar9->DC).PrevLineSize.y = 0.0;
  if ((uVar16 & 0x800200) == 0x200) {
    fVar30 = (pIVar13->Style).CellPadding.x;
LAB_0014550b:
    fVar31 = 0.0;
  }
  else {
    if ((uVar16 & 0x800200) != 0) goto LAB_0014550b;
    fVar31 = (pIVar13->Style).CellPadding.x;
  }
  table->CellSpacingX1 = fVar32 + fVar31;
  table->CellSpacingX2 = fVar31;
  table->CellPaddingX = fVar30;
  table->CellPaddingY = (pIVar13->Style).CellPadding.y;
  fVar32 = 0.0;
  fVar31 = 0.0;
  if ((uVar16 >> 10 & 1) != 0) {
    fVar31 = 1.0;
  }
  if ((uVar16 >> 0x16 & 1) == 0 && (uVar16 & 0x200400) != 0) {
    fVar32 = (pIVar13->Style).CellPadding.x;
  }
  table->OuterPaddingX = (fVar31 + fVar32) - fVar30;
  table->CurrentRow = -1;
  table->CurrentColumn = -1;
  table->RowBgColorCounter = 0;
  pIVar18 = &pIVar9->ClipRect;
  if (pIVar9 == outer_window) {
    pIVar18 = &table->WorkRect;
  }
  *(uint *)&table->field_0x98 = (uint)*(ushort *)&table->field_0x98;
  IVar12 = pIVar18->Max;
  (table->InnerClipRect).Min = pIVar18->Min;
  (table->InnerClipRect).Max = IVar12;
  ImRect::ClipWith(&table->InnerClipRect,&table->WorkRect);
  ImRect::ClipWithFull(&table->InnerClipRect,&table->HostClipRect);
  if ((uVar16 >> 0x11 & 1) == 0) {
    fVar30 = (pIVar9->ClipRect).Max.y;
  }
  else {
    fVar30 = (table->InnerClipRect).Max.y;
    fVar32 = (pIVar9->WorkRect).Max.y;
    if (fVar32 <= fVar30) {
      fVar30 = fVar32;
    }
  }
  (table->InnerClipRect).Max.y = fVar30;
  fVar30 = (table->WorkRect).Min.y;
  table->RowPosY2 = fVar30;
  table->RowPosY1 = fVar30;
  table->RowTextBaseline = 0.0;
  table->FreezeRowsRequest = '\0';
  table->FreezeRowsCount = '\0';
  table->FreezeColumnsRequest = '\0';
  table->FreezeColumnsCount = '\0';
  table->IsUnfrozenRows = true;
  table->DeclColumnsCount = '\0';
  IVar17 = GetColorU32(0x2b,1.0);
  table->BorderColorStrong = IVar17;
  IVar17 = GetColorU32(0x2c,1.0);
  table->BorderColorLight = IVar17;
  pIVar13->CurrentTable = table;
  (outer_window->DC).CurrentTableIdx = iVar25;
  if (pIVar9 != outer_window) {
    (pIVar9->DC).CurrentTableIdx = iVar25;
  }
  if (((uVar5 & 2) != 0) && ((uVar16 & 2) == 0)) {
    table->IsResetDisplayOrderRequest = true;
  }
  if ((pIVar13->TablesLastTimeActive).Size <= iVar25) {
    local_a8.TableIndex = -0x40800000;
    ImVector<float>::resize(&pIVar13->TablesLastTimeActive,iVar25 + 1,(float *)&local_a8);
  }
  dVar4 = pIVar13->Time;
  (pIVar13->TablesLastTimeActive).Data[iVar25] = (float)dVar4;
  pIVar8[lVar19 + -1].LastTimeActive = (float)dVar4;
  table->MemoryCompacted = false;
  pvVar10 = table->RawData;
  pIVar27 = (table->Columns).Data;
  iVar22 = (int)(((long)(table->Columns).DataEnd - (long)pIVar27) / 0x68);
  if (iVar22 == columns_count || iVar22 == 0) {
    pIVar27 = (ImGuiTableColumn *)0x0;
    ptr = (void *)0x0;
    pvVar14 = (void *)0x0;
    if (pvVar10 == (void *)0x0) goto LAB_00145732;
  }
  else {
    table->RawData = (void *)0x0;
    pvVar14 = pvVar10;
LAB_00145732:
    ptr = pvVar14;
    TableBeginInitMemory(table,columns_count);
    table->IsSettingsRequestLoad = true;
    table->IsInitializing = true;
  }
  if (table->IsResetAllRequest == true) {
    table->IsInitializing = true;
    table->IsResetAllRequest = false;
    table->IsSettingsRequestLoad = false;
    table->IsSettingsDirty = true;
    table->SettingsLoadedFlags = 0;
  }
  else if ((table->IsInitializing & 1U) == 0) goto LAB_001458c7;
  table->SettingsOffset = -1;
  table->IsSortSpecsDirty = true;
  table->InstanceInteracted = -1;
  table->ContextPopupColumn = -1;
  table->ReorderColumn = -1;
  lVar19 = 0;
  uVar24 = 0;
  if (0 < columns_count) {
    uVar24 = (ulong)(uint)columns_count;
  }
  table->LastResizedColumn = -1;
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  table->AutoFitSingleColumn = -1;
  table->ResizedColumn = -1;
  for (uVar26 = 0; uVar24 != uVar26; uVar26 = uVar26 + 1) {
    pIVar11 = (table->Columns).Data;
    puVar23 = (undefined8 *)((long)&pIVar11->Flags + lVar19);
    if ((pIVar27 == (ImGuiTableColumn *)0x0) || ((long)iVar22 <= (long)uVar26)) {
      uVar3 = *(undefined4 *)((long)&pIVar11->WidthAuto + lVar19);
      local_a8.DrawSplitter._Channels.Data = (ImDrawChannel *)0x0;
      local_a8.HostBackupWorkRect.Min.x._0_3_ = 0;
      local_a8.HostBackupWorkRect.Min._3_5_ = 0;
      local_a8.DrawSplitter._Current = 0;
      local_a8.DrawSplitter._Count = 0;
      local_a8.DrawSplitter._Channels.Size = 0;
      local_a8.DrawSplitter._Channels.Capacity = 0;
      local_a8.HostBackupWorkRect.Max.x = 0.0;
      local_a8.TableIndex = 0;
      local_a8.LastTimeActive = 0.0;
      local_a8.UserOuterSize.x = 0.0;
      local_a8.UserOuterSize.y = 0.0;
      local_a8.HostBackupParentWorkRect.Min.x._0_3_ = 0xffffff;
      local_a8.HostBackupWorkRect.Max.y = -NAN;
      *puVar23 = 0;
      puVar23[1] = 0;
      *(undefined4 *)((long)&pIVar11->WidthRequest + lVar19) = 0xbf800000;
      *(undefined4 *)((long)&pIVar11->StretchWeight + lVar19) = 0xbf800000;
      puVar23 = (undefined8 *)((long)&pIVar11->InitStretchWeightOrWidth + lVar19);
      *puVar23 = 0;
      puVar23[1] = 0;
      puVar23 = (undefined8 *)((long)&(pIVar11->ClipRect).Max.y + lVar19);
      *puVar23 = 0;
      puVar23[1] = 0;
      puVar23 = (undefined8 *)((long)&pIVar11->ItemWidth + lVar19);
      *puVar23 = 0;
      puVar23[1] = 0;
      puVar23 = (undefined8 *)((long)&pIVar11->ContentMaxXUnfrozen + lVar19 + 3);
      *puVar23 = 0;
      puVar23[1] = 0xffffffffffffff00;
      *(undefined8 *)(&pIVar11->IsUserEnabledNextFrame + lVar19) = 0;
      *(undefined4 *)(&pIVar11->AutoFitQueue + lVar19) = 0;
      *(undefined4 *)((long)&pIVar11->WidthAuto + lVar19) = uVar3;
      (&pIVar11->IsPreserveWidthAuto)[lVar19] = true;
      *(undefined2 *)(&pIVar11->IsUserEnabled + lVar19) = 0x101;
      *(undefined4 *)(&pIVar11->DrawChannelCurrent + lVar19) = 0x1ffffff;
    }
    else {
      puVar21 = (undefined1 *)((long)&pIVar27->Flags + lVar19);
      for (lVar20 = 0x67; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(undefined1 *)puVar23 = *puVar21;
        puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
        puVar23 = (undefined8 *)((long)puVar23 + (ulong)bVar28 * -2 + 1);
      }
    }
    (table->DisplayOrderToIndex).Data[uVar26] = (ImGuiTableColumnIdx)uVar26;
    (&pIVar11->DisplayOrder)[lVar19] = (ImGuiTableColumnIdx)uVar26;
    lVar19 = lVar19 + 0x68;
  }
LAB_001458c7:
  if (ptr != (void *)0x0) {
    MemFree(ptr);
  }
  if (table->IsSettingsRequestLoad == true) {
    TableLoadSettings(table);
  }
  fVar30 = pIVar13->FontSize;
  fVar32 = table->RefScale;
  if ((fVar32 != 0.0) || (NAN(fVar32))) {
    if ((fVar32 != fVar30) || (NAN(fVar32) || NAN(fVar30))) {
      uVar26 = 0;
      uVar24 = (ulong)(uint)columns_count;
      if (columns_count < 1) {
        uVar24 = uVar26;
      }
      for (; uVar24 * 0x68 - uVar26 != 0; uVar26 = uVar26 + 0x68) {
        pIVar27 = (table->Columns).Data;
        *(float *)((long)&pIVar27->WidthRequest + uVar26) =
             *(float *)((long)&pIVar27->WidthRequest + uVar26) * (fVar30 / fVar32);
      }
    }
  }
  table->RefScale = fVar30;
  pIVar9->SkipItems = true;
  if (0 < (table->ColumnsNames).Buf.Size) {
    ImVector<char>::resize(&(table->ColumnsNames).Buf,0);
  }
  TableBeginApplyRequests(table);
  return true;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Acquire temporary buffers
    const int table_idx = g.Tables.GetIndex(table);
    if (++g.TablesTempDataStacked > g.TablesTempData.Size)
        g.TablesTempData.resize(g.TablesTempDataStacked, ImGuiTableTempData());
    ImGuiTableTempData* temp_data = table->TempData = &g.TablesTempData[g.TablesTempDataStacked - 1];
    temp_data->TableIndex = table_idx;
    table->DrawSplitter = &table->TempData->DrawSplitter;
    table->DrawSplitter->Clear();

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    temp_data->UserOuterSize = outer_size;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    temp_data->HostBackupWorkRect = inner_window->WorkRect;
    temp_data->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    temp_data->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    temp_data->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    temp_data->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    temp_data->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    temp_data->HostBackupItemWidth = outer_window->DC.ItemWidth;
    temp_data->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    temp_data->LastTimeActive = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    ImGuiTableColumn* old_columns_to_preserve = NULL;
    void* old_columns_raw_data = NULL;
    const int old_columns_count = table->Columns.size();
    if (old_columns_count != 0 && old_columns_count != columns_count)
    {
        // Attempt to preserve width on column count change (#4046)
        old_columns_to_preserve = table->Columns.Data;
        old_columns_raw_data = table->RawData;
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            if (old_columns_to_preserve && n < old_columns_count)
            {
                // FIXME: We don't attempt to preserve column order in this path.
                *column = old_columns_to_preserve[n];
            }
            else
            {
                float width_auto = column->WidthAuto;
                *column = ImGuiTableColumn();
                column->WidthAuto = width_auto;
                column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
                column->IsEnabled = column->IsUserEnabled = column->IsUserEnabledNextFrame = true;
            }
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
        }
    }
    if (old_columns_raw_data)
        IM_FREE(old_columns_raw_data);

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}